

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall
iqxmlrpc::http::Request_header::set_authinfo(Request_header *this,string *u,string *p)

{
  Binary_data *pBVar1;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  scoped_ptr<iqxmlrpc::Binary_data> local_78;
  scoped_ptr<iqxmlrpc::Binary_data> bin_authinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string h;
  string *p_local;
  string *u_local;
  Request_header *this_local;
  
  h.field_2._8_8_ = p;
  std::operator+(&local_60,u,":");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 h.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_60);
  pBVar1 = Binary_data::from_data((string *)local_40);
  boost::scoped_ptr<iqxmlrpc::Binary_data>::scoped_ptr(&local_78,pBVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"authorization",&local_99);
  pBVar1 = boost::scoped_ptr<iqxmlrpc::Binary_data>::operator->(&local_78);
  __rhs = Binary_data::get_base64_abi_cxx11_(pBVar1);
  std::operator+(&local_c0,"Basic ",__rhs);
  Header::set_option(&this->super_Header,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  boost::scoped_ptr<iqxmlrpc::Binary_data>::~scoped_ptr(&local_78);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Request_header::set_authinfo(const std::string& u, const std::string& p)
{
  std::string h = u + ":" + p;
  boost::scoped_ptr<Binary_data> bin_authinfo( Binary_data::from_data(h) );
  set_option( names::authorization, "Basic " + bin_authinfo->get_base64() );
}